

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_unsigned_int> google::protobuf::internal::ReadTagFallback(char *p,uint32 res)

{
  uint uVar1;
  pair<const_char_*,_unsigned_int> pVar3;
  long lStack_8;
  ulong uVar2;
  
  uVar1 = ((uint)(byte)p[2] * 0x4000 + res) - 0x4000;
  uVar2 = (ulong)uVar1;
  if (p[2] < '\0') {
    uVar1 = (uVar1 + (uint)(byte)p[3] * 0x200000) - 0x200000;
    uVar2 = (ulong)uVar1;
    if (p[3] < '\0') {
      if (p[4] < '\0') {
        return (pair<const_char_*,_unsigned_int>)ZEXT816(0);
      }
      uVar2 = (ulong)(uVar1 + (uint)(byte)p[4] * 0x10000000 + 0xf0000000);
      lStack_8 = 4;
    }
    else {
      lStack_8 = 3;
    }
  }
  else {
    lStack_8 = 2;
  }
  pVar3.first = p + lStack_8 + 1;
  pVar3._8_8_ = uVar2;
  return pVar3;
}

Assistant:

std::pair<const char*, uint32> ReadTagFallback(const char* p, uint32 res) {
  for (std::uint32_t i = 2; i < 5; i++) {
    uint32 byte = static_cast<uint8>(p[i]);
    res += (byte - 1) << (7 * i);
    if (PROTOBUF_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}